

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList
               (ImGuiWindow *window,ImGuiViewportP *viewport,ImDrawList *draw_list,char *label)

{
  long lVar1;
  ImGuiWindow *pIVar2;
  ImDrawVert *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ImGuiWindow *window_1;
  uint7 uVar10;
  char *pcVar9;
  undefined8 extraout_RDX;
  ulong uVar11;
  long lVar12;
  bool show_mesh;
  uint uVar13;
  ImDrawList *pIVar14;
  ImVec4 *buf_00;
  unsigned_short *puVar15;
  ImDrawCmd *draw_cmd;
  bool bVar16;
  undefined4 uVar17;
  float fVar18;
  ImVec2 triangle [3];
  ImVec2 triangle_1 [3];
  char buf [300];
  ImGuiListClipper local_1d8;
  ulong local_1c0;
  undefined8 local_1b8;
  ImDrawList *local_1b0;
  uint local_1a4;
  ImDrawCmd *local_1a0;
  ulong local_198;
  ImVec2 local_190;
  ImVec2 local_188 [4];
  ImVec4 local_168 [18];
  undefined1 local_3c [12];
  
  pcVar9 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar9 = draw_list->_OwnerName;
  }
  bVar5 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds","DrawList",pcVar9,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,(draw_list->CmdBuffer).Size);
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->DrawList == draw_list) {
    if (pIVar2->SkipItems == false) {
      (pIVar2->DC).CursorPos.x = (pIVar4->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
      (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
      (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
      (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
    }
    local_168[0].x = 1.0;
    local_168[0].y = 0.4;
    local_168[0].z = 0.4;
    local_168[0].w = 1.0;
    TextColored(local_168,"CURRENTLY APPENDING");
    if (!bVar5) {
      return;
    }
  }
  else {
    if (viewport == (ImGuiViewportP *)0x0) {
      bVar16 = window != (ImGuiWindow *)0x0;
      local_1b8 = 0;
      local_1b0 = (ImDrawList *)0x0;
    }
    else {
      local_1b0 = GetViewportDrawList(viewport,1,"##Foreground");
      bVar16 = window != (ImGuiWindow *)0x0;
      local_1b8 = CONCAT71((int7)((ulong)local_1b0 >> 8),local_1b0 != (ImDrawList *)0x0);
      uVar10 = (uint7)((ulong)extraout_RDX >> 8) & 0xffffff;
      if (bVar16 && local_1b0 != (ImDrawList *)0x0) {
        bVar16 = IsItemHovered(0);
        local_1b8 = CONCAT71(uVar10,1);
        if (bVar16) {
          local_168[0].y = (window->Size).y + (window->Pos).y;
          local_168[0].x = (window->Size).x + (window->Pos).x;
          ImDrawList::AddRect(local_1b0,&window->Pos,(ImVec2 *)local_168,0xff00ffff,0.0,0xf,1.0);
        }
        bVar16 = true;
      }
    }
    pIVar14 = local_1b0;
    if (!bVar5) {
      return;
    }
    if ((bVar16) && (window->WasActive == false)) {
      TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
    }
    if (0 < (draw_list->CmdBuffer).Size) {
      draw_cmd = (draw_list->CmdBuffer).Data;
      uVar11 = 0;
      do {
        if (draw_cmd->UserCallback == (ImDrawCallback)0x0) {
          if (draw_cmd->ElemCount != 0) {
            if ((draw_list->IdxBuffer).Size < 1) {
              puVar15 = (unsigned_short *)0x0;
            }
            else {
              puVar15 = (draw_list->IdxBuffer).Data;
            }
            local_1c0 = uVar11;
            ImFormatString((char *)local_168,300,
                           "DrawCmd:%5d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                           SUB84((double)(draw_cmd->ClipRect).x,0),
                           SUB84((double)(draw_cmd->ClipRect).y,0),(double)(draw_cmd->ClipRect).z,
                           (double)(draw_cmd->ClipRect).w,(ulong)draw_cmd->ElemCount / 3);
            bVar5 = TreeNode((void *)(((long)draw_cmd - (long)(draw_list->CmdBuffer).Data >> 3) *
                                     0x6db6db6db6db6db7),"%s",local_168);
            bVar16 = IsItemHovered(0);
            if (bVar16) {
              if (show_drawcmd_mesh == false) {
                if ((show_drawcmd_aabb & (byte)local_1b8) == 1) {
                  show_mesh = false;
                  bVar16 = true;
                  goto LAB_001449eb;
                }
              }
              else if ((byte)local_1b8 != 0) {
                show_mesh = true;
                bVar16 = show_drawcmd_aabb;
LAB_001449eb:
                NodeDrawCmdShowMeshAndBoundingBox
                          (pIVar14,draw_list,draw_cmd,(int)local_1c0,show_mesh,bVar16);
              }
            }
            uVar11 = local_1c0;
            if (bVar5) {
              uVar8 = draw_cmd->ElemCount;
              uVar6 = uVar8 + (uint)local_1c0;
              uVar17 = 0;
              if ((uint)local_1c0 < uVar6) {
                iVar7 = (draw_list->VtxBuffer).Size;
                uVar11 = local_1c0 & 0xffffffff;
                fVar18 = 0.0;
                do {
                  local_1d8.DisplayStart = 0;
                  local_1d8.DisplayEnd = 0;
                  local_1d8.ItemsCount = 0;
                  local_1d8.StepNo = 0;
                  local_1d8.ItemsHeight = 0.0;
                  local_1d8.StartPosY = 0.0;
                  lVar12 = 0;
                  do {
                    uVar13 = (uint)(uVar11 + lVar12);
                    if (puVar15 != (unsigned_short *)0x0) {
                      uVar13 = (uint)puVar15[uVar11 + lVar12 & 0xffffffff];
                    }
                    if (((int)uVar13 < 0) || (iVar7 <= (int)uVar13)) {
LAB_00144d56:
                      __assert_fail("i >= 0 && i < Size",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                                    ,0x5c2,
                                    "T &ImVector<ImDrawVert>::operator[](int) [T = ImDrawVert]");
                    }
                    *(ImVec2 *)(&local_1d8.DisplayStart + lVar12 * 2) =
                         (draw_list->VtxBuffer).Data[uVar13].pos;
                    lVar12 = lVar12 + 1;
                  } while (lVar12 != 3);
                  fVar18 = fVar18 + ABS(((float)local_1d8.DisplayEnd - (float)local_1d8.StepNo) *
                                        local_1d8.ItemsHeight +
                                        ((float)local_1d8.StepNo - local_1d8.StartPosY) *
                                        (float)local_1d8.DisplayStart +
                                        (local_1d8.StartPosY - (float)local_1d8.DisplayEnd) *
                                        (float)local_1d8.ItemsCount) * 0.5;
                  uVar11 = uVar11 + 3;
                } while ((uint)uVar11 < uVar6);
                uVar17 = SUB84((double)fVar18,0);
              }
              ImFormatString((char *)local_168,300,
                             "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                             uVar17,(ulong)uVar8,(ulong)draw_cmd->VtxOffset);
              local_1d8.DisplayStart = 0;
              local_1d8.DisplayEnd = 0;
              Selectable((char *)local_168,false,0,(ImVec2 *)&local_1d8);
              bVar5 = IsItemHovered(0);
              if (((byte)local_1b8 & bVar5) != 0) {
                NodeDrawCmdShowMeshAndBoundingBox
                          (pIVar14,draw_list,draw_cmd,(int)local_1c0,true,false);
              }
              local_1d8.StartPosY = (GImGui->CurrentWindow->DC).CursorPos.y;
              local_1d8.ItemsCount = draw_cmd->ElemCount / 3;
              local_1d8.StepNo = 0;
              local_1d8.ItemsHeight = -1.0;
              local_1d8.DisplayStart = -1;
              local_1d8.DisplayEnd = 0;
              local_1a0 = draw_cmd;
              while (bVar5 = ImGuiListClipper::Step(&local_1d8), bVar5) {
                local_1a4 = local_1d8.DisplayEnd;
                if (local_1d8.DisplayStart < local_1d8.DisplayEnd) {
                  uVar11 = (ulong)(uint)(local_1d8.DisplayStart * 3 + (int)local_1c0);
                  uVar8 = local_1d8.DisplayStart;
                  do {
                    local_198 = (ulong)uVar8;
                    local_188[0].x = 0.0;
                    local_188[0].y = 0.0;
                    local_188[1].x = 0.0;
                    local_188[1].y = 0.0;
                    local_188[2].x = 0.0;
                    local_188[2].y = 0.0;
                    lVar12 = 0;
                    buf_00 = local_168;
                    do {
                      lVar1 = (uVar11 & 0xffffffff) + lVar12;
                      if (puVar15 == (unsigned_short *)0x0) {
                        uVar8 = (uint)lVar1;
                      }
                      else {
                        uVar8 = (uint)puVar15[(int)uVar11 + lVar12];
                      }
                      if (((int)uVar8 < 0) || ((draw_list->VtxBuffer).Size <= (int)uVar8))
                      goto LAB_00144d56;
                      pIVar3 = (draw_list->VtxBuffer).Data;
                      local_188[lVar12] = pIVar3[uVar8].pos;
                      pcVar9 = "     ";
                      if (lVar12 == 0) {
                        pcVar9 = "Vert:";
                      }
                      iVar7 = ImFormatString((char *)buf_00,(size_t)(local_3c + -(long)buf_00),
                                             "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n"
                                             ,SUB84((double)pIVar3[uVar8].pos.x,0),
                                             SUB84((double)pIVar3[uVar8].pos.y,0),
                                             (double)pIVar3[uVar8].uv.x,(double)pIVar3[uVar8].uv.y,
                                             pcVar9,lVar1,(ulong)pIVar3[uVar8].col);
                      buf_00 = (ImVec4 *)((long)&buf_00->x + (long)iVar7);
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 3);
                    local_190.x = 0.0;
                    local_190.y = 0.0;
                    Selectable((char *)local_168,false,0,&local_190);
                    if (((byte)local_1b8 != '\0') &&
                       (bVar5 = IsItemHovered(0), pIVar14 = local_1b0, bVar5)) {
                      uVar8 = local_1b0->Flags;
                      local_1b0->Flags = uVar8 & 0xfffffffe;
                      ImDrawList::AddPolyline(local_1b0,local_188,3,0xff00ffff,true,1.0);
                      pIVar14->Flags = uVar8;
                    }
                    uVar11 = (uVar11 & 0xffffffff) + 3;
                    uVar8 = (int)local_198 + 1;
                  } while (uVar8 != local_1a4);
                }
              }
              TreePop();
              pIVar14 = local_1b0;
              uVar11 = local_1c0;
              draw_cmd = local_1a0;
              if ((float)local_1d8.ItemsCount != -NAN) {
                __assert_fail("ItemsCount == -1 && \"Forgot to call End(), or to Step() until false?\""
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                              ,0x8c6,"ImGuiListClipper::~ImGuiListClipper()");
              }
            }
          }
        }
        else {
          BulletText("Callback %p, user_data %p",draw_cmd->UserCallback,draw_cmd->UserCallbackData);
        }
        uVar11 = (ulong)((int)uVar11 + draw_cmd->ElemCount);
        draw_cmd = draw_cmd + 1;
      } while (draw_cmd < (draw_list->CmdBuffer).Data + (draw_list->CmdBuffer).Size);
    }
  }
  TreePop();
  return;
}

Assistant:

static void NodeDrawList(ImGuiWindow* window, ImGuiViewportP* viewport, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f, 0.4f, 0.4f, 1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = viewport ? GetForegroundDrawList(viewport) : NULL; // Render additional visuals into the top-most draw list
            if (window && fg_draw_list && ImGui::IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            if (window && !window->WasActive)
                ImGui::TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

            unsigned int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }

                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                char buf[300];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd:%5d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                    pcmd->ElemCount / 3, (void*)(intptr_t)pcmd->TextureId,
                    pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
                if (ImGui::IsItemHovered() && (show_drawcmd_mesh || show_drawcmd_aabb) && fg_draw_list)
                    NodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, elem_offset, show_drawcmd_mesh, show_drawcmd_aabb);
                if (!pcmd_node_open)
                    continue;

                // Calculate approximate coverage area (touched pixel count)
                // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
                float total_area = 0.0f;
                for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + pcmd->ElemCount); base_idx += 3)
                {
                    ImVec2 triangle[3];
                    for (int n = 0; n < 3; n++)
                        triangle[n] = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
                }

                // Display vertex information summary. Hover to get all triangles drawn in wire-frame
                ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
                ImGui::Selectable(buf);
                if (ImGui::IsItemHovered() && fg_draw_list)
                    NodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, elem_offset, true, false);

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper;
                clipper.Begin(pcmd->ElemCount / 3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart * 3; prim < clipper.DisplayEnd; prim++)
                    {
                        char* buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangle[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                            triangle[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }

                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }